

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O1

int __thiscall QtMWidgets::SliderPrivate::init(SliderPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  ColorGroup CVar3;
  long *plVar4;
  QFontMetrics aQStack_18 [8];
  
  QFontMetrics::QFontMetrics(aQStack_18,(QFont *)(*(long *)&this->q->field_0x20 + 0x38));
  iVar2 = QFontMetrics::ascent();
  this->radius = iVar2;
  QFontMetrics::~QFontMetrics(aQStack_18);
  QAbstractSlider::orientation();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  CVar3 = QWidget::palette();
  plVar4 = (long *)QPalette::brush(CVar3,Dark);
  uVar1 = *(undefined8 *)(*plVar4 + 0xe);
  *(undefined8 *)&this->highlightColor = *(undefined8 *)(*plVar4 + 8);
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = uVar1;
  return (int)uVar1;
}

Assistant:

void
SliderPrivate::init()
{
	radius = q->fontMetrics().ascent();

	QSizePolicy sp( QSizePolicy::Expanding, QSizePolicy::Fixed );

	if( q->orientation() == Qt::Vertical )
		sp.transpose();

	q->setSizePolicy( sp );

	highlightColor = q->palette().color( QPalette::Highlight );
}